

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O1

io_context * gmlc::networking::AsioContextManager::getContext(string *contextName)

{
  io_context *piVar1;
  _func_int **local_18;
  element_type *local_10;
  
  getContextPointer((AsioContextManager *)&stack0xffffffffffffffe8,contextName);
  piVar1 = (io_context *)local_18[8];
  if (local_10 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10);
  }
  return piVar1;
}

Assistant:

asio::io_context& AsioContextManager::getContext(const std::string& contextName)
{
    return getContextPointer(contextName)->getBaseContext();
}